

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void add_bulk_impl(roaring_bitmap_t *r,roaring_bulk_context_t *context,uint32_t val)

{
  int iVar1;
  container_t *pcVar2;
  uint8_t new_typecode;
  uint8_t typecode;
  int idx;
  uint8_t local_2e;
  uint8_t local_2d;
  int local_2c;
  
  if ((context->container == (container_t *)0x0) || (val >> 0x10 != (uint)context->key)) {
    pcVar2 = containerptr_roaring_bitmap_add(r,val,&local_2d,&local_2c);
    context->container = pcVar2;
    context->typecode = local_2d;
    context->idx = local_2c;
    context->key = (uint16_t)(val >> 0x10);
  }
  else {
    pcVar2 = container_add(context->container,(uint16_t)val,context->typecode,&local_2e);
    if (pcVar2 != context->container) {
      container_free(context->container,context->typecode);
      iVar1 = context->idx;
      (r->high_low_container).containers[iVar1] = pcVar2;
      (r->high_low_container).typecodes[iVar1] = local_2e;
      context->typecode = local_2e;
      context->container = pcVar2;
    }
  }
  return;
}

Assistant:

static inline void add_bulk_impl(roaring_bitmap_t *r,
                                 roaring_bulk_context_t *context,
                                 uint32_t val) {
    uint16_t key = val >> 16;
    if (context->container == NULL || context->key != key) {
        uint8_t typecode;
        int idx;
        context->container =
            containerptr_roaring_bitmap_add(r, val, &typecode, &idx);
        context->typecode = typecode;
        context->idx = idx;
        context->key = key;
    } else {
        // no need to seek the container, it is at hand
        // because we already have the container at hand, we can do the
        // insertion directly, bypassing the roaring_bitmap_add call
        uint8_t new_typecode;
        container_t *container2 = container_add(
            context->container, val & 0xFFFF, context->typecode, &new_typecode);
        if (container2 != context->container) {
            // rare instance when we need to change the container type
            container_free(context->container, context->typecode);
            ra_set_container_at_index(&r->high_low_container, context->idx,
                                      container2, new_typecode);
            context->typecode = new_typecode;
            context->container = container2;
        }
    }
}